

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::flip32(tetgenmesh *this,triface *fliptets,int hullflag,flipconstraints *fc)

{
  uint uVar1;
  point pdVar2;
  tetrahedron p2;
  tetrahedron p3;
  tetrahedron p2_00;
  tetrahedron p1;
  tetrahedron p0;
  double dVar3;
  face *local_200;
  face *local_1e8;
  triface *local_1d0;
  triface *local_1b0;
  undefined1 local_1a8 [8];
  face flipfaces [2];
  undefined1 local_180 [8];
  face checksh;
  double vol_diff;
  double volpos [2];
  double volneg [3];
  int local_138;
  int local_134;
  int j;
  int i;
  int t1ver;
  int scount;
  int spivot;
  int dummyflag;
  double volume;
  double attrib;
  point pe;
  point pd;
  point pc;
  point pb;
  point pa;
  face checkseg;
  face flipshs [3];
  triface casface;
  triface newface;
  triface botcastets [3];
  triface topcastets [3];
  flipconstraints *fc_local;
  int hullflag_local;
  triface *fliptets_local;
  tetgenmesh *this_local;
  
  local_1b0 = (triface *)&botcastets[2].ver;
  topcastets[2]._8_8_ = fc;
  do {
    triface::triface(local_1b0);
    local_1b0 = local_1b0 + 1;
  } while (local_1b0 != (triface *)&topcastets[2].ver);
  local_1d0 = (triface *)&newface.ver;
  do {
    triface::triface(local_1d0);
    local_1d0 = local_1d0 + 1;
  } while (local_1d0 != (triface *)&botcastets[2].ver);
  triface::triface((triface *)&casface.ver);
  triface::triface((triface *)&flipshs[2].shver);
  local_1e8 = (face *)&checkseg.shver;
  do {
    face::face(local_1e8);
    local_1e8 = local_1e8 + 1;
  } while (local_1e8 != (face *)&flipshs[2].shver);
  face::face((face *)&pa);
  scount = 0;
  t1ver = -1;
  i = 0;
  if (0 < hullflag) {
    pdVar2 = org(this,fliptets);
    if (pdVar2 == this->dummypoint) {
      for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
        esymself(this,fliptets + local_134);
      }
      triface::operator=((triface *)&casface.ver,fliptets + 1);
      triface::operator=(fliptets + 1,fliptets + 2);
      triface::operator=(fliptets + 2,(triface *)&casface.ver);
      scount = -1;
    }
    else {
      pdVar2 = apex(this,fliptets);
      if (pdVar2 == this->dummypoint) {
        scount = 1;
        triface::operator=((triface *)&casface.ver,fliptets);
        triface::operator=(fliptets,fliptets + 1);
        triface::operator=(fliptets + 1,fliptets + 2);
        triface::operator=(fliptets + 2,(triface *)&casface.ver);
      }
      else {
        pdVar2 = apex(this,fliptets + 1);
        if (pdVar2 == this->dummypoint) {
          scount = 2;
          triface::operator=((triface *)&casface.ver,fliptets);
          triface::operator=(fliptets,fliptets + 2);
          triface::operator=(fliptets + 2,fliptets + 1);
          triface::operator=(fliptets + 1,(triface *)&casface.ver);
        }
        else {
          scount = 0;
        }
      }
    }
  }
  p2 = (tetrahedron)apex(this,fliptets);
  p3 = (tetrahedron)apex(this,fliptets + 1);
  p2_00 = (tetrahedron)apex(this,fliptets + 2);
  p1 = (tetrahedron)dest(this,fliptets);
  p0 = (tetrahedron)org(this,fliptets);
  this->flip32count = this->flip32count + 1;
  for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
    eorgoppo(this,fliptets + local_134,(triface *)&flipshs[2].shver);
    fsym(this,(triface *)&flipshs[2].shver,(triface *)&botcastets[(long)local_134 + 2].ver);
  }
  for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
    edestoppo(this,fliptets + local_134,(triface *)&flipshs[2].shver);
    fsym(this,(triface *)&flipshs[2].shver,(triface *)&botcastets[(long)local_134 + -1].ver);
  }
  if (this->checksubfaceflag != 0) {
    for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
      tspivot(this,fliptets + local_134,(face *)&flipshs[(long)local_134 + -1].shver);
      if (*(long *)&flipshs[(long)local_134 + -1].shver == 0) {
        t1ver = local_134;
      }
      else {
        stdissolve(this,(face *)&flipshs[(long)local_134 + -1].shver);
        i = i + 1;
      }
    }
  }
  fliptets->ver = 0xb;
  fliptets[1].ver = 0xb;
  setelemmarker(this,fliptets->tet,0);
  setelemmarker(this,fliptets[1].tet,0);
  if (this->checksubsegflag != 0) {
    if (fliptets->tet[8] != (tetrahedron)0x0) {
      memorypool::dealloc(this->tet2segpool,fliptets->tet[8]);
      fliptets->tet[8] = (tetrahedron)0x0;
    }
    if (fliptets[1].tet[8] != (tetrahedron)0x0) {
      memorypool::dealloc(this->tet2segpool,fliptets[1].tet[8]);
      fliptets[1].tet[8] = (tetrahedron)0x0;
    }
  }
  if (this->checksubfaceflag != 0) {
    if (fliptets->tet[9] != (tetrahedron)0x0) {
      memorypool::dealloc(this->tet2subpool,fliptets->tet[9]);
      fliptets->tet[9] = (tetrahedron)0x0;
    }
    if (fliptets[1].tet[9] != (tetrahedron)0x0) {
      memorypool::dealloc(this->tet2subpool,fliptets[1].tet[9]);
      fliptets[1].tet[9] = (tetrahedron)0x0;
    }
  }
  if ((this->checksubfaceflag != 0) && (0 < i)) {
    for (local_138 = 0; local_138 < 2; local_138 = local_138 + 1) {
      for (local_134 = 0; local_134 < this->numelemattrib; local_134 = local_134 + 1) {
        dVar3 = elemattribute(this,fliptets[t1ver].tet,local_134);
        setelemattribute(this,fliptets[local_138].tet,local_134,dVar3);
      }
      if (this->b->varvolume != 0) {
        dVar3 = volumebound(this,fliptets[t1ver].tet);
        setvolumebound(this,fliptets[local_138].tet,dVar3);
      }
    }
  }
  tetrahedrondealloc(this,fliptets[2].tet);
  if (hullflag < 1) {
    fliptets->tet[orgpivot[fliptets->ver]] = p2;
    fliptets->tet[destpivot[fliptets->ver]] = p3;
    fliptets->tet[apexpivot[fliptets->ver]] = p2_00;
    fliptets->tet[oppopivot[fliptets->ver]] = p1;
    fliptets[1].tet[orgpivot[fliptets[1].ver]] = p3;
    fliptets[1].tet[destpivot[fliptets[1].ver]] = p2;
    fliptets[1].tet[apexpivot[fliptets[1].ver]] = p2_00;
    fliptets[1].tet[oppopivot[fliptets[1].ver]] = p0;
  }
  else if (p2_00 == (tetrahedron)this->dummypoint) {
    fliptets->tet[orgpivot[fliptets->ver]] = p3;
    fliptets->tet[destpivot[fliptets->ver]] = p2;
    fliptets->tet[apexpivot[fliptets->ver]] = p1;
    fliptets->tet[oppopivot[fliptets->ver]] = p2_00;
    fliptets[1].tet[orgpivot[fliptets[1].ver]] = p2;
    fliptets[1].tet[destpivot[fliptets[1].ver]] = p3;
    fliptets[1].tet[apexpivot[fliptets[1].ver]] = p0;
    fliptets[1].tet[oppopivot[fliptets[1].ver]] = p2_00;
    esymself(this,fliptets);
    esymself(this,fliptets + 1);
  }
  else {
    if (p1 == (tetrahedron)this->dummypoint) {
      this->hullsize = this->hullsize + -2;
    }
    fliptets->tet[orgpivot[fliptets->ver]] = p2;
    fliptets->tet[destpivot[fliptets->ver]] = p3;
    fliptets->tet[apexpivot[fliptets->ver]] = p2_00;
    fliptets->tet[oppopivot[fliptets->ver]] = p1;
    fliptets[1].tet[orgpivot[fliptets[1].ver]] = p3;
    fliptets[1].tet[destpivot[fliptets[1].ver]] = p2;
    fliptets[1].tet[apexpivot[fliptets[1].ver]] = p2_00;
    fliptets[1].tet[oppopivot[fliptets[1].ver]] = p0;
  }
  if (*(int *)(topcastets[2]._8_8_ + 0x14) != 0) {
    if (p2_00 == (tetrahedron)this->dummypoint) {
      volpos[1] = tetprismvol(this,(double *)p0,(double *)p1,(double *)p2,(double *)p3);
      volneg[0] = 0.0;
      volneg[1] = 0.0;
      vol_diff = 0.0;
      volpos[0] = 0.0;
    }
    else if (p1 == (tetrahedron)this->dummypoint) {
      volpos[1] = 0.0;
      volneg[0] = 0.0;
      volneg[1] = 0.0;
      vol_diff = 0.0;
      volpos[0] = tetprismvol(this,(double *)p3,(double *)p2,(double *)p2_00,(double *)p0);
    }
    else {
      volpos[1] = tetprismvol(this,(double *)p0,(double *)p1,(double *)p2,(double *)p3);
      volneg[0] = tetprismvol(this,(double *)p0,(double *)p1,(double *)p3,(double *)p2_00);
      volneg[1] = tetprismvol(this,(double *)p0,(double *)p1,(double *)p2_00,(double *)p2);
      vol_diff = tetprismvol(this,(double *)p2,(double *)p3,(double *)p2_00,(double *)p1);
      volpos[0] = tetprismvol(this,(double *)p3,(double *)p2,(double *)p2_00,(double *)p0);
    }
    checksh._8_8_ = (((vol_diff + volpos[0]) - volpos[1]) - volneg[0]) - volneg[1];
    *(double *)(topcastets[2]._8_8_ + 0x20) =
         (double)checksh._8_8_ + *(double *)(topcastets[2]._8_8_ + 0x20);
  }
  bond(this,fliptets,fliptets + 1);
  for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
    esym(this,fliptets,(triface *)&casface.ver);
    bond(this,(triface *)&casface.ver,(triface *)&botcastets[(long)local_134 + 2].ver);
    enextself(this,fliptets);
  }
  for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
    esym(this,fliptets + 1,(triface *)&casface.ver);
    bond(this,(triface *)&casface.ver,(triface *)&botcastets[(long)local_134 + -1].ver);
    eprevself(this,fliptets + 1);
  }
  if (this->checksubsegflag != 0) {
    for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
      if ((*(long *)(*(long *)&botcastets[(long)local_134 + 2].ver + 0x40) != 0) &&
         (*(long *)(*(long *)(*(long *)&botcastets[(long)local_134 + 2].ver + 0x40) +
                   (long)ver2edge[*(int *)&topcastets[local_134].tet] * 8) != 0)) {
        tsspivot1(this,(triface *)&botcastets[(long)local_134 + 2].ver,(face *)&pa);
        tssbond1(this,fliptets,(face *)&pa);
        sstbond1(this,(face *)&pa,fliptets);
        tssbond1(this,fliptets + 1,(face *)&pa);
        sstbond1(this,(face *)&pa,fliptets + 1);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,(face *)&pa);
        }
      }
      enextself(this,fliptets);
      eprevself(this,fliptets + 1);
    }
    for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
      esym(this,fliptets,(triface *)&casface.ver);
      eprevself(this,(triface *)&casface.ver);
      enext(this,(triface *)&botcastets[(long)local_134 + 2].ver,(triface *)&flipshs[2].shver);
      if ((*(long *)(flipshs[2]._8_8_ + 0x40) != 0) &&
         (*(long *)(*(long *)(flipshs[2]._8_8_ + 0x40) + (long)ver2edge[(int)casface.tet] * 8) != 0)
         ) {
        tsspivot1(this,(triface *)&flipshs[2].shver,(face *)&pa);
        tssbond1(this,(triface *)&casface.ver,(face *)&pa);
        sstbond1(this,(face *)&pa,(triface *)&casface.ver);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,(face *)&pa);
        }
      }
      enextself(this,fliptets);
    }
    for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
      esym(this,fliptets + 1,(triface *)&casface.ver);
      enextself(this,(triface *)&casface.ver);
      eprev(this,(triface *)&botcastets[(long)local_134 + -1].ver,(triface *)&flipshs[2].shver);
      if ((*(long *)(flipshs[2]._8_8_ + 0x40) != 0) &&
         (*(long *)(*(long *)(flipshs[2]._8_8_ + 0x40) + (long)ver2edge[(int)casface.tet] * 8) != 0)
         ) {
        tsspivot1(this,(triface *)&flipshs[2].shver,(face *)&pa);
        tssbond1(this,(triface *)&casface.ver,(face *)&pa);
        sstbond1(this,(face *)&pa,(triface *)&casface.ver);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,(face *)&pa);
        }
      }
      eprevself(this,fliptets + 1);
    }
  }
  if (this->checksubfaceflag != 0) {
    face::face((face *)local_180);
    for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
      if ((*(long *)(*(long *)&botcastets[(long)local_134 + 2].ver + 0x48) != 0) &&
         (*(long *)(*(long *)(*(long *)&botcastets[(long)local_134 + 2].ver + 0x48) +
                   (long)(int)(*(uint *)&topcastets[local_134].tet & 3) * 8) != 0)) {
        tspivot(this,(triface *)&botcastets[(long)local_134 + 2].ver,(face *)local_180);
        esym(this,fliptets,(triface *)&casface.ver);
        sesymself(this,(face *)local_180);
        tsbond(this,(triface *)&casface.ver,(face *)local_180);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 2) != 0) {
          enqueuesubface(this,this->badsubfacs,(face *)local_180);
        }
      }
      enextself(this,fliptets);
    }
    for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
      if ((*(long *)(*(long *)&botcastets[(long)local_134 + -1].ver + 0x48) != 0) &&
         (*(long *)(*(long *)(*(long *)&botcastets[(long)local_134 + -1].ver + 0x48) +
                   (long)(int)(*(uint *)&botcastets[local_134].tet & 3) * 8) != 0)) {
        tspivot(this,(triface *)&botcastets[(long)local_134 + -1].ver,(face *)local_180);
        esym(this,fliptets + 1,(triface *)&casface.ver);
        sesymself(this,(face *)local_180);
        tsbond(this,(triface *)&casface.ver,(face *)local_180);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 2) != 0) {
          enqueuesubface(this,this->badsubfacs,(face *)local_180);
        }
      }
      eprevself(this,fliptets + 1);
    }
    if (0 < i) {
      local_200 = (face *)local_1a8;
      do {
        face::face(local_200);
        local_200 = local_200 + 1;
      } while (local_200 != (face *)&flipfaces[1].shver);
      face::operator=((face *)local_1a8,(face *)&flipshs[(long)((t1ver + 1) % 3) + -1].shver);
      face::operator=((face *)&flipfaces[0].shver,
                      (face *)&flipshs[(long)((t1ver + 2) % 3) + -1].shver);
      sesymself(this,(face *)&flipfaces[0].shver);
      flip22(this,(face *)local_1a8,0,*(int *)(topcastets[2]._8_8_ + 4));
      triface::operator=((triface *)&botcastets[2].ver,fliptets);
      triface::operator=((triface *)&newface.ver,fliptets + 1);
      for (local_134 = 0; local_134 < (t1ver + 1) % 3; local_134 = local_134 + 1) {
        enextself(this,(triface *)&botcastets[2].ver);
        eprevself(this,(triface *)&newface.ver);
      }
      esymself(this,(triface *)&botcastets[2].ver);
      sesymself(this,(face *)local_1a8);
      tspivot(this,(triface *)&botcastets[2].ver,(face *)local_180);
      if (local_180 == (undefined1  [8])0x0) {
        tsbond(this,(triface *)&botcastets[2].ver,(face *)local_1a8);
        uVar1 = (uint)topcastets[0].tet;
        decode(this,*(tetrahedron *)
                     (botcastets[2]._8_8_ + (long)(int)((uint)topcastets[0].tet & 3) * 8),
               (triface *)&botcastets[2].ver);
        topcastets[0].tet._0_4_ = fsymtbl[(int)uVar1][(int)(uint)topcastets[0].tet];
        sesymself(this,(face *)local_1a8);
        tsbond(this,(triface *)&botcastets[2].ver,(face *)local_1a8);
      }
      else {
        terminatetetgen(this,2);
      }
      esymself(this,(triface *)&newface.ver);
      sesymself(this,(face *)&flipfaces[0].shver);
      tspivot(this,(triface *)&newface.ver,(face *)local_180);
      if (local_180 == (undefined1  [8])0x0) {
        tsbond(this,(triface *)&newface.ver,(face *)&flipfaces[0].shver);
        uVar1 = (uint)botcastets[0].tet;
        decode(this,*(tetrahedron *)(newface._8_8_ + (long)(int)((uint)botcastets[0].tet & 3) * 8),
               (triface *)&newface.ver);
        botcastets[0].tet._0_4_ = fsymtbl[(int)uVar1][(int)(uint)botcastets[0].tet];
        sesymself(this,(face *)&flipfaces[0].shver);
        tsbond(this,(triface *)&newface.ver,(face *)&flipfaces[0].shver);
      }
      else {
        terminatetetgen(this,2);
      }
    }
  }
  if ((*(uint *)(topcastets[2]._8_8_ + 4) & 4) != 0) {
    for (local_134 = 0; local_134 < 2; local_134 = local_134 + 1) {
      enqueuetetrahedron(this,fliptets + local_134);
    }
  }
  setpoint2tet(this,(point)p2,(tetrahedron)fliptets->tet);
  setpoint2tet(this,(point)p3,(tetrahedron)fliptets->tet);
  setpoint2tet(this,(point)p2_00,(tetrahedron)fliptets->tet);
  setpoint2tet(this,(point)p1,(tetrahedron)fliptets->tet);
  setpoint2tet(this,(point)p0,(tetrahedron)fliptets[1].tet);
  if ((0 < hullflag) && (scount != 0)) {
    if (scount == -1) {
      triface::operator=((triface *)&casface.ver,fliptets);
      triface::operator=(fliptets,fliptets + 1);
      triface::operator=(fliptets + 1,(triface *)&casface.ver);
    }
    else if (scount == 1) {
      eprevself(this,fliptets);
      enextself(this,fliptets + 1);
    }
    else {
      enextself(this,fliptets);
      eprevself(this,fliptets + 1);
    }
  }
  if (0 < *(int *)topcastets[2]._8_8_) {
    enextesym(this,fliptets,(triface *)&casface.ver);
    flippush(this,&this->flipstack,(triface *)&casface.ver);
    eprevesym(this,fliptets + 1,(triface *)&casface.ver);
    flippush(this,&this->flipstack,(triface *)&casface.ver);
    if (1 < *(int *)topcastets[2]._8_8_) {
      eprevesym(this,fliptets,(triface *)&casface.ver);
      flippush(this,&this->flipstack,(triface *)&casface.ver);
      enextesym(this,fliptets + 1,(triface *)&casface.ver);
      flippush(this,&this->flipstack,(triface *)&casface.ver);
      esym(this,fliptets,(triface *)&casface.ver);
      flippush(this,&this->flipstack,(triface *)&casface.ver);
      esym(this,fliptets + 1,(triface *)&casface.ver);
      flippush(this,&this->flipstack,(triface *)&casface.ver);
    }
  }
  triface::operator=(&this->recenttet,fliptets);
  return;
}

Assistant:

void tetgenmesh::flip32(triface* fliptets, int hullflag, flipconstraints *fc)
{
  triface topcastets[3], botcastets[3];
  triface newface, casface;
  face flipshs[3]; 
  face checkseg; 
  point pa, pb, pc, pd, pe;
  REAL attrib, volume;
  int dummyflag = 0;  // Rangle = {-1, 0, 1, 2}
  int spivot = -1, scount = 0; // for flip22()
  int t1ver; 
  int i, j;

  if (hullflag > 0) {
    // Check if e is 'dummypoint'.
    if (org(fliptets[0]) == dummypoint) {
      // Reverse the edge.
      for (i = 0; i < 3; i++) {
        esymself(fliptets[i]);
      }
      // Swap the last two tets.
      newface = fliptets[1];
      fliptets[1] = fliptets[2];
      fliptets[2] = newface;
      dummyflag = -1; // e is dummypoint.
    } else {
      // Check if a or b is the 'dummypoint'.
      if (apex(fliptets[0]) == dummypoint) { 
        dummyflag = 1;  // a is dummypoint.
        newface = fliptets[0];
        fliptets[0] = fliptets[1];
        fliptets[1] = fliptets[2];
        fliptets[2] = newface;
      } else if (apex(fliptets[1]) == dummypoint) {
        dummyflag = 2;  // b is dummypoint.
        newface = fliptets[0];
        fliptets[0] = fliptets[2];
        fliptets[2] = fliptets[1];
        fliptets[1] = newface;
      } else {
        dummyflag = 0;  // either c or d may be dummypoint.
      }
    }
  }

  pa = apex(fliptets[0]);
  pb = apex(fliptets[1]);
  pc = apex(fliptets[2]);
  pd = dest(fliptets[0]);
  pe = org(fliptets[0]);

  flip32count++;

  // Get the outer boundary faces.
  for (i = 0; i < 3; i++) {
    eorgoppo(fliptets[i], casface);
    fsym(casface, topcastets[i]);
  }
  for (i = 0; i < 3; i++) {
    edestoppo(fliptets[i], casface);
    fsym(casface, botcastets[i]);
  }

  if (checksubfaceflag) {
    // Check if there are interior subfaces at the edge [e,d].
    for (i = 0; i < 3; i++) {
      tspivot(fliptets[i], flipshs[i]);
      if (flipshs[i].sh != NULL) {
        // Found an interior subface.
        stdissolve(flipshs[i]); // Disconnect the sub-tet bond.
        scount++;
      } else {
        spivot = i;
      }
    }
  }

  // Re-use fliptets[0] and fliptets[1].
  fliptets[0].ver = 11;
  fliptets[1].ver = 11;
  setelemmarker(fliptets[0].tet, 0); // Clear all flags.
  setelemmarker(fliptets[1].tet, 0);
  if (checksubsegflag) {
    // Dealloc the space to subsegments.
    if (fliptets[0].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[0].tet[8]);
      fliptets[0].tet[8] = NULL;
    }
    if (fliptets[1].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[1].tet[8]);
      fliptets[1].tet[8] = NULL;
    }
  }
  if (checksubfaceflag) {
    // Dealloc the space to subfaces.
    if (fliptets[0].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[0].tet[9]);
      fliptets[0].tet[9] = NULL;
    }
    if (fliptets[1].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[1].tet[9]);
      fliptets[1].tet[9] = NULL;
    }
  }
  if (checksubfaceflag) {
    if (scount > 0) {
      // The element attributes and volume constraint must be set correctly.
      // There are two subfaces involved in this flip. The three tets are
      //   separated into two different regions, one may be exterior. The
      //   first region has two tets, and the second region has only one.
      //   The two created tets must be in the same region as the first region. 
      //   The element attributes and volume constraint must be set correctly.
      //assert(spivot != -1);
      // The tet fliptets[spivot] is in the first region.
      for (j = 0; j < 2; j++) {
        for (i = 0; i < numelemattrib; i++) {
          attrib = elemattribute(fliptets[spivot].tet, i);
          setelemattribute(fliptets[j].tet, i, attrib);
        }
        if (b->varvolume) {
          volume = volumebound(fliptets[spivot].tet);
          setvolumebound(fliptets[j].tet, volume);
        }
      }
    }
  }
  // Delete an old tet.
  tetrahedrondealloc(fliptets[2].tet);

  if (hullflag > 0) {
    // Check if c is dummypointc.
    if (pc != dummypoint) {
      // Check if d is dummypoint.
      if (pd != dummypoint) {
        // No hull tet is involved.
      } else {
        // We deleted three hull tets, and created one hull tet.
        hullsize -= 2;
      }
      setvertices(fliptets[0], pa, pb, pc, pd);
      setvertices(fliptets[1], pb, pa, pc, pe);
    } else {
      // c is dummypoint. The two new tets are hull tets.
      setvertices(fliptets[0], pb, pa, pd, pc);
      setvertices(fliptets[1], pa, pb, pe, pc);
      // Adjust badc -> abcd.
      esymself(fliptets[0]);
      // Adjust abec -> bace.
      esymself(fliptets[1]);
      // The hullsize does not change.
    }
  } else {
    setvertices(fliptets[0], pa, pb, pc, pd);
    setvertices(fliptets[1], pb, pa, pc, pe);
  }

  if (fc->remove_ndelaunay_edge) { // calc_tetprism_vol
    REAL volneg[3], volpos[2], vol_diff;
    if (pc != dummypoint) {
      if (pd != dummypoint) {
        volneg[0] = tetprismvol(pe, pd, pa, pb);
        volneg[1] = tetprismvol(pe, pd, pb, pc);
        volneg[2] = tetprismvol(pe, pd, pc, pa);
        volpos[0] = tetprismvol(pa, pb, pc, pd);
        volpos[1] = tetprismvol(pb, pa, pc, pe);
      } else { // pd == dummypoint
        volneg[0] = 0.;
        volneg[1] = 0.;
        volneg[2] = 0.;
        volpos[0] = 0.;
        volpos[1] = tetprismvol(pb, pa, pc, pe);
      }
    } else { // pc == dummypoint.
      volneg[0] = tetprismvol(pe, pd, pa, pb);
      volneg[1] = 0.;
      volneg[2] = 0.;
      volpos[0] = 0.;
      volpos[1] = 0.;
    }
    vol_diff = volpos[0] + volpos[1] - volneg[0] - volneg[1] - volneg[2];
    fc->tetprism_vol_sum  += vol_diff; // Update the total sum.
  }

  // Bond abcd <==> bace.
  bond(fliptets[0], fliptets[1]);
  // Bond new faces to top outer boundary faces (at abcd).
  for (i = 0; i < 3; i++) {
    esym(fliptets[0], newface);
    bond(newface, topcastets[i]);
    enextself(fliptets[0]);
  }
  // Bond new faces to bottom outer boundary faces (at bace).
  for (i = 0; i < 3; i++) {
    esym(fliptets[1], newface);
    bond(newface, botcastets[i]);
    eprevself(fliptets[1]);
  }

  if (checksubsegflag) {
    // Bond 9 segments to new (flipped) tets.
    for (i = 0; i < 3; i++) { // edges a->b, b->c, c->a.      
      if (issubseg(topcastets[i])) {
        tsspivot1(topcastets[i], checkseg);
        tssbond1(fliptets[0], checkseg);
        sstbond1(checkseg, fliptets[0]);
        tssbond1(fliptets[1], checkseg);
        sstbond1(checkseg, fliptets[1]);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
      eprevself(fliptets[1]);
    }
    // The three top edges.
    for (i = 0; i < 3; i++) { // edges b->d, c->d, a->d.
      esym(fliptets[0], newface);
      eprevself(newface); 
      enext(topcastets[i], casface);      
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
    }
    // The three bot edges.
    for (i = 0; i < 3; i++) { // edges b<-e, c<-e, a<-e.
      esym(fliptets[1], newface);
      enextself(newface); 
      eprev(botcastets[i], casface);
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      eprevself(fliptets[1]);
    }
  } // if (checksubsegflag)

  if (checksubfaceflag) {
    face checksh;
    // Bond the top three casing subfaces.
    for (i = 0; i < 3; i++) { // At edges [b,a], [c,b], [a,c]
      if (issubface(topcastets[i])) {
        tspivot(topcastets[i], checksh);
        esym(fliptets[0], newface); 
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
      enextself(fliptets[0]);
    }
    // Bond the bottom three casing subfaces.
    for (i = 0; i < 3; i++) { // At edges [a,b], [b,c], [c,a]
      if (issubface(botcastets[i])) {
        tspivot(botcastets[i], checksh);
        esym(fliptets[1], newface); 
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
      eprevself(fliptets[1]);
    }

    if (scount > 0) {
      face flipfaces[2];
      // Perform a 2-to-2 flip in subfaces.
      flipfaces[0] = flipshs[(spivot + 1) % 3];
      flipfaces[1] = flipshs[(spivot + 2) % 3];
      sesymself(flipfaces[1]);
      flip22(flipfaces, 0, fc->chkencflag);
      // Connect the flipped subfaces to flipped tets.
      // First go to the corresponding flipping edge.
      //   Re-use top- and botcastets[0].
      topcastets[0] = fliptets[0];
      botcastets[0] = fliptets[1];
      for (i = 0; i < ((spivot + 1) % 3); i++) {
        enextself(topcastets[0]);
        eprevself(botcastets[0]);
      }
      // Connect the top subface to the top tets.
      esymself(topcastets[0]);
      sesymself(flipfaces[0]);
      // Check if there already exists a subface.
      tspivot(topcastets[0], checksh);
      if (checksh.sh == NULL) {
        tsbond(topcastets[0], flipfaces[0]);
        fsymself(topcastets[0]);
        sesymself(flipfaces[0]);
        tsbond(topcastets[0], flipfaces[0]);
      } else {
        // An invalid 2-to-2 flip. Report a bug.
        terminatetetgen(this, 2); 
      }
      // Connect the bot subface to the bottom tets.
      esymself(botcastets[0]);
      sesymself(flipfaces[1]);
      // Check if there already exists a subface.
      tspivot(botcastets[0], checksh);
      if (checksh.sh == NULL) {
        tsbond(botcastets[0], flipfaces[1]);
        fsymself(botcastets[0]);
        sesymself(flipfaces[1]);
        tsbond(botcastets[0], flipfaces[1]);
      } else {
        // An invalid 2-to-2 flip. Report a bug.
        terminatetetgen(this, 2);  
      }
    } // if (scount > 0)
  } // if (checksubfaceflag)

  if (fc->chkencflag & 4) {
    // Put two new tets into check list.
    for (i = 0; i < 2; i++) {
      enqueuetetrahedron(&(fliptets[i]));
    }
  }

  setpoint2tet(pa, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pb, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pc, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pd, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pe, (tetrahedron) fliptets[1].tet);

  if (hullflag > 0) {
    if (dummyflag != 0) {
      // Restore the original position of the points (for flipnm()).
      if (dummyflag == -1) {
        // e were dummypoint. Swap the two new tets.
        newface = fliptets[0];
        fliptets[0] = fliptets[1];
        fliptets[1] = newface;
      } else {
        // a or b was dummypoint.
        if (dummyflag == 1) {
          eprevself(fliptets[0]);
          enextself(fliptets[1]);
        } else { // dummyflag == 2
          enextself(fliptets[0]);
          eprevself(fliptets[1]);
        }
      }
    }
  }
  
  if (fc->enqflag > 0) {
    // Queue faces which may be locally non-Delaunay.
    // pa = org(fliptets[0]); // 'a' may be a new vertex.
    enextesym(fliptets[0], newface);
    flippush(flipstack, &newface);
    eprevesym(fliptets[1], newface);
    flippush(flipstack, &newface);
    if (fc->enqflag > 1) {
      //pb = dest(fliptets[0]);
      eprevesym(fliptets[0], newface);
      flippush(flipstack, &newface);
      enextesym(fliptets[1], newface);
      flippush(flipstack, &newface);
      //pc = apex(fliptets[0]);
      esym(fliptets[0], newface);
      flippush(flipstack, &newface);
      esym(fliptets[1], newface);
      flippush(flipstack, &newface);
    }
  }

  recenttet = fliptets[0];
}